

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O0

int Abc_NodeTravId(Abc_Obj_t *p)

{
  uint i;
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *p_local;
  
  pAVar2 = Abc_ObjNtk(p);
  i = Abc_ObjId(p);
  iVar1 = Vec_IntGetEntry(&pAVar2->vTravIds,i);
  return iVar1;
}

Assistant:

static inline int         Abc_NodeTravId( Abc_Obj_t * p )                   { return Vec_IntGetEntry(&Abc_ObjNtk(p)->vTravIds, Abc_ObjId(p));                       }